

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O1

future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getFuture(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,string *name)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Ptr_type _Var3;
  int iVar4;
  mapped_type *pmVar5;
  _State_baseV2 *__tmp;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fVar6;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> V;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50
  ;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise(&local_50);
  std::
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  __basic_future((__basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,&local_50._M_future);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(name + 3));
  if (iVar4 == 0) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&name[1].field_2,in_RDX);
    _Var3._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
    .
    super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         local_50._M_storage._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
         .
         super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
         ._M_head_impl;
    _Var2._M_pi = local_50._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_50._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_50._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
    .
    super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(__uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
            )0x0;
    local_50._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pmVar5->_M_future).
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (pmVar5->_M_future).
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    local_38._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (pmVar5->_M_future).
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    (pmVar5->_M_future).
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    local_38._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
    .
    super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(pmVar5->_M_storage)._M_t.
           super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
           .
           super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl;
    (pmVar5->_M_storage)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
    .
    super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)_Var3._M_t.
            super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
            .
            super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
            ._M_head_impl;
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~promise(&local_38);
    pthread_mutex_unlock((pthread_mutex_t *)(name + 3));
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~promise(&local_50);
    fVar6.
    super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    fVar6.
    super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           )fVar6.
            super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

std::future<X> getFuture(const std::string& name)
    {
        auto V = std::promise<X>();
        auto fut = V.get_future();
        std::lock_guard<std::mutex> lock(promiseLock);
        promiseByString[name] = std::move(V);
        return fut;
    }